

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  char cVar10;
  ulong *puVar11;
  string desc;
  string __str;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ulong *local_50;
  uint local_48;
  ulong local_40 [2];
  
  pcVar1 = (app->description_)._M_dataplus._M_p;
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (app->description_)._M_string_length);
  uVar9 = app->require_option_min_;
  uVar7 = app->require_option_max_;
  if (app->required_ == true) {
    ::std::__cxx11::string::append((char *)&local_b0);
  }
  if (uVar9 == 0 || uVar7 != uVar9) {
    if (uVar7 == 0) {
      if (uVar9 == 0) goto LAB_001136d4;
      cVar10 = '\x01';
      if (9 < uVar9) {
        uVar7 = uVar9;
        cVar3 = '\x04';
        do {
          cVar10 = cVar3;
          if (uVar7 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_001134ac;
          }
          if (uVar7 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_001134ac;
          }
          if (uVar7 < 10000) goto LAB_001134ac;
          bVar2 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar3 = cVar10 + '\x04';
        } while (bVar2);
        cVar10 = cVar10 + '\x01';
      }
LAB_001134ac:
      local_d0 = &local_c0;
      ::std::__cxx11::string::_M_construct((ulong)&local_d0,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,(uint)local_c8,uVar9);
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x145128);
      local_110 = &local_100;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_100 = *plVar5;
        uStack_f8 = puVar4[3];
      }
      else {
        local_100 = *plVar5;
        local_110 = (long *)*puVar4;
      }
      local_108 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_e0 = *plVar8;
        lStack_d8 = plVar5[3];
      }
      else {
        local_e0 = *plVar8;
        local_f0 = (long *)*plVar5;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_f0);
      goto LAB_0011368f;
    }
    cVar10 = '\x01';
    if (uVar9 == 0) {
      if (9 < uVar7) {
        uVar9 = uVar7;
        cVar3 = '\x04';
        do {
          cVar10 = cVar3;
          if (uVar9 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_001135a1;
          }
          if (uVar9 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_001135a1;
          }
          if (uVar9 < 10000) goto LAB_001135a1;
          bVar2 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar3 = cVar10 + '\x04';
        } while (bVar2);
        cVar10 = cVar10 + '\x01';
      }
LAB_001135a1:
      local_d0 = &local_c0;
      ::std::__cxx11::string::_M_construct((ulong)&local_d0,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,(uint)local_c8,uVar7);
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1450f5);
      local_110 = &local_100;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_100 = *plVar5;
        uStack_f8 = puVar4[3];
      }
      else {
        local_100 = *plVar5;
        local_110 = (long *)*puVar4;
      }
      local_108 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_110);
      local_f0 = &local_e0;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_e0 = *plVar8;
        lStack_d8 = plVar5[3];
      }
      else {
        local_e0 = *plVar8;
        local_f0 = (long *)*plVar5;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_f0);
      goto LAB_0011368f;
    }
    if (9 < uVar9) {
      uVar6 = uVar9;
      cVar3 = '\x04';
      do {
        cVar10 = cVar3;
        if (uVar6 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00113153;
        }
        if (uVar6 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00113153;
        }
        if (uVar6 < 10000) goto LAB_00113153;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar3 = cVar10 + '\x04';
      } while (bVar2);
      cVar10 = cVar10 + '\x01';
    }
LAB_00113153:
    local_50 = local_40;
    ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,uVar9);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1450c4);
    local_70 = &local_60;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_70);
    puVar11 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar11) {
      local_c0 = *puVar11;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar11;
      local_d0 = (ulong *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)puVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar10 = '\x01';
    if (9 < uVar7) {
      uVar9 = uVar7;
      cVar3 = '\x04';
      do {
        cVar10 = cVar3;
        if (uVar9 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_001132a5;
        }
        if (uVar9 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_001132a5;
        }
        if (uVar9 < 10000) goto LAB_001132a5;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar3 = cVar10 + '\x04';
      } while (bVar2);
      cVar10 = cVar10 + '\x01';
    }
LAB_001132a5:
    local_90 = local_80;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar7);
    uVar9 = CONCAT44(uStack_84,local_88) + local_c8;
    uVar7 = 0xf;
    if (local_d0 != &local_c0) {
      uVar7 = local_c0;
    }
    if (uVar7 < uVar9) {
      uVar7 = 0xf;
      if (local_90 != local_80) {
        uVar7 = local_80[0];
      }
      if (uVar7 < uVar9) goto LAB_00113325;
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00113325:
      puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
    }
    local_110 = &local_100;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_100 = *plVar5;
      uStack_f8 = puVar4[3];
    }
    else {
      local_100 = *plVar5;
      local_110 = (long *)*puVar4;
    }
    local_108 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_110);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_e0 = *plVar8;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar8;
      local_f0 = (long *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    puVar11 = local_50;
    if (local_50 == local_40) goto LAB_001136d4;
  }
  else {
    if (uVar9 == 1) {
      ::std::__cxx11::string::append((char *)&local_b0);
      goto LAB_001136d4;
    }
    cVar10 = '\x01';
    if (9 < uVar9) {
      uVar7 = uVar9;
      cVar3 = '\x04';
      do {
        cVar10 = cVar3;
        if (uVar7 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00113059;
        }
        if (uVar7 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00113059;
        }
        if (uVar7 < 10000) goto LAB_00113059;
        bVar2 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar3 = cVar10 + '\x04';
      } while (bVar2);
      cVar10 = cVar10 + '\x01';
    }
LAB_00113059:
    local_d0 = &local_c0;
    ::std::__cxx11::string::_M_construct((ulong)&local_d0,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,(uint)local_c8,uVar9);
    puVar4 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x14508a);
    local_110 = &local_100;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_100 = *plVar5;
      uStack_f8 = puVar4[3];
    }
    else {
      local_100 = *plVar5;
      local_110 = (long *)*puVar4;
    }
    local_108 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_110);
    local_f0 = &local_e0;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_e0 = *plVar8;
      lStack_d8 = plVar5[3];
    }
    else {
      local_e0 = *plVar8;
      local_f0 = (long *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_f0);
LAB_0011368f:
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    local_40[0] = local_c0;
    puVar11 = local_d0;
    if (local_d0 == &local_c0) goto LAB_001136d4;
  }
  operator_delete(puVar11,local_40[0] + 1);
LAB_001136d4:
  if (local_a8 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_b0,local_a8 + (long)local_b0);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " REQUIRED ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + "options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}